

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::LocalAccessChainConvertPass::GenAccessChainStoreReplacement
          (LocalAccessChainConvertPass *this,Instruction *ptrInst,uint32_t valId,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *newInsts)

{
  IRContext *pIVar1;
  DecorationManager *pDVar2;
  bool bVar3;
  array<signed_char,_4UL> to;
  array<signed_char,_4UL> aVar4;
  uint32_t index;
  pointer *__ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *pdVar5;
  pointer *__ptr_1;
  long lVar6;
  uint32_t varId;
  uint32_t varPteTypeId;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ins_in_opnds;
  array<signed_char,_4UL> local_120;
  uint32_t local_11c;
  undefined1 local_118 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_f8;
  undefined1 local_f0 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_d0;
  undefined1 local_c8 [16];
  pointer local_b8;
  uint local_b0 [2];
  uint *local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined1 local_90 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_70;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  index = (ptrInst->has_result_id_ & 1) + 1;
  if (ptrInst->has_type_id_ == false) {
    index = (uint)ptrInst->has_result_id_;
  }
  if ((int)((ulong)((long)(ptrInst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(ptrInst->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - index == 1
     ) {
    local_118._16_4_ = Instruction::GetSingleWordOperand(ptrInst,index);
    local_118._24_8_ = local_118 + 0x10;
    local_118._0_8_ = &PTR__SmallVector_00930a20;
    local_f8._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_118._8_8_ = 1;
    local_c8._0_4_ = 1;
    local_c8._8_8_ = &PTR__SmallVector_00930a20;
    local_b8 = (pointer)0x0;
    local_a8 = local_b0;
    local_a0 = 0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8),
               (SmallVector<unsigned_int,_2UL> *)local_118);
    local_f0._24_8_ = local_f0 + 0x10;
    local_f0._0_8_ = &PTR__SmallVector_00930a20;
    local_d0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_f0._8_8_ = 1;
    local_98 = 1;
    local_90._0_8_ = &PTR__SmallVector_00930a20;
    local_90._8_8_ = 0;
    local_90._24_8_ = local_90 + 0x10;
    pdVar5 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_70;
    local_70._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_f0._16_4_ = valId;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_90,(SmallVector<unsigned_int,_2UL> *)local_f0
              );
    local_68.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_68,
               local_c8,&local_68);
    BuildAndAppendInst(this,OpStore,0,0,&local_68,newInsts);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_68)
    ;
    lVar6 = -0x60;
    do {
      *(undefined ***)(pdVar5 + -0x20) = &PTR__SmallVector_00930a20;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar5 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar5,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar5);
      }
      *(undefined8 *)pdVar5 = 0;
      pdVar5 = pdVar5 + -0x30;
      lVar6 = lVar6 + 0x30;
    } while (lVar6 != 0);
    local_f0._0_8_ = &PTR__SmallVector_00930a20;
    if (local_d0._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl !=
        (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_d0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_d0._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    local_118._0_8_ = &PTR__SmallVector_00930a20;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_f8._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_f8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_f8._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
LAB_005d5648:
    bVar3 = true;
  }
  else {
    to._M_elems = (_Type)BuildAndAppendVarLoad
                                   (this,ptrInst,(uint32_t *)&local_120,&local_11c,newInsts);
    if (to._M_elems != (_Type)0x0) {
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
        IRContext::BuildDecorationManager(pIVar1);
      }
      aVar4._M_elems = local_120._M_elems;
      pDVar2 = (pIVar1->decoration_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
               _M_head_impl;
      local_c8._0_8_ = operator_new(4);
      local_c8._8_8_ = local_c8._0_8_ + 4;
      *(Decoration *)local_c8._0_8_ = DecorationRelaxedPrecision;
      local_b8 = (pointer)local_c8._8_8_;
      analysis::DecorationManager::CloneDecorations
                (pDVar2,(uint32_t)aVar4._M_elems,(uint32_t)to._M_elems,
                 (vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)local_c8);
      if ((pointer)local_c8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_c8._0_8_,(long)local_b8 - local_c8._0_8_);
      }
      aVar4._M_elems = (_Type)Pass::TakeNextId((Pass *)this);
      if (aVar4._M_elems != (_Type)0x0) {
        local_118._24_8_ = local_118 + 0x10;
        local_118._0_8_ = &PTR__SmallVector_00930a20;
        local_f8._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x0;
        local_118._8_8_ = 1;
        local_c8._0_4_ = 1;
        local_c8._8_8_ = &PTR__SmallVector_00930a20;
        local_b8 = (pointer)0x0;
        local_a8 = local_b0;
        local_a0 = 0;
        local_118._16_4_ = valId;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8),
                   (SmallVector<unsigned_int,_2UL> *)local_118);
        local_f0._24_8_ = local_f0 + 0x10;
        local_f0._0_8_ = &PTR__SmallVector_00930a20;
        local_d0._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x0;
        local_f0._8_8_ = 1;
        local_98 = 1;
        local_90._0_8_ = &PTR__SmallVector_00930a20;
        local_90._8_8_ = 0;
        local_90._24_8_ = local_90 + 0x10;
        pdVar5 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_70;
        local_70._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x0;
        local_f0._16_4_ = to._M_elems;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)local_90,
                   (SmallVector<unsigned_int,_2UL> *)local_f0);
        local_68.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        _M_range_initialize<spvtools::opt::Operand_const*>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &local_68,local_c8,&local_68);
        lVar6 = -0x60;
        do {
          *(undefined ***)(pdVar5 + -0x20) = &PTR__SmallVector_00930a20;
          if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar5 !=
              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()(pdVar5,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar5);
          }
          *(undefined8 *)pdVar5 = 0;
          pdVar5 = pdVar5 + -0x30;
          lVar6 = lVar6 + 0x30;
        } while (lVar6 != 0);
        local_f0._0_8_ = &PTR__SmallVector_00930a20;
        if (local_d0._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl !=
            (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_d0,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     local_d0._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl);
        }
        local_118._0_8_ = &PTR__SmallVector_00930a20;
        if (local_f8._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl !=
            (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_f8,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     local_f8._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl);
        }
        AppendConstantOperands(this,ptrInst,&local_68);
        BuildAndAppendInst(this,OpCompositeInsert,local_11c,(uint32_t)aVar4._M_elems,&local_68,
                           newInsts);
        pIVar1 = (this->super_MemPass).super_Pass.context_;
        if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
          IRContext::BuildDecorationManager(pIVar1);
        }
        pDVar2 = (pIVar1->decoration_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                 _M_head_impl;
        local_c8._0_8_ = operator_new(4);
        local_c8._8_8_ = local_c8._0_8_ + 4;
        *(Decoration *)local_c8._0_8_ = DecorationRelaxedPrecision;
        local_b8 = (pointer)local_c8._8_8_;
        analysis::DecorationManager::CloneDecorations
                  (pDVar2,(uint32_t)local_120._M_elems,(uint32_t)aVar4._M_elems,
                   (vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)local_c8);
        if ((pointer)local_c8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_c8._0_8_,(long)local_b8 - local_c8._0_8_);
        }
        local_118._0_8_ = &PTR__SmallVector_00930a20;
        local_118._24_8_ = local_118 + 0x10;
        local_f8._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x0;
        local_118[0x10] = local_120._M_elems[0];
        local_118[0x11] = local_120._M_elems[1];
        local_118[0x12] = local_120._M_elems[2];
        local_118[0x13] = local_120._M_elems[3];
        local_118._8_8_ = 1;
        local_c8._0_4_ = 1;
        local_c8._8_8_ = &PTR__SmallVector_00930a20;
        local_b8 = (pointer)0x0;
        local_a8 = local_b0;
        local_a0 = 0;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8),
                   (SmallVector<unsigned_int,_2UL> *)local_118);
        local_f0._0_8_ = &PTR__SmallVector_00930a20;
        local_f0._24_8_ = local_f0 + 0x10;
        local_d0._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x0;
        local_f0._8_8_ = 1;
        local_98 = 1;
        local_90._0_8_ = &PTR__SmallVector_00930a20;
        local_90._8_8_ = 0;
        local_90._24_8_ = local_90 + 0x10;
        pdVar5 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_70;
        local_70._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x0;
        local_f0._16_4_ = aVar4._M_elems;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)local_90,
                   (SmallVector<unsigned_int,_2UL> *)local_f0);
        local_48 = 0;
        uStack_40 = 0;
        local_38 = 0;
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        _M_range_initialize<spvtools::opt::Operand_const*>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &local_48,local_c8,&local_68);
        BuildAndAppendInst(this,OpStore,0,0,
                           (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            *)&local_48,newInsts);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &local_48);
        lVar6 = -0x60;
        do {
          *(undefined ***)(pdVar5 + -0x20) = &PTR__SmallVector_00930a20;
          if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar5 !=
              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()(pdVar5,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar5);
          }
          *(undefined8 *)pdVar5 = 0;
          pdVar5 = pdVar5 + -0x30;
          lVar6 = lVar6 + 0x30;
        } while (lVar6 != 0);
        local_f0._0_8_ = &PTR__SmallVector_00930a20;
        if (local_d0._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl !=
            (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_d0,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     local_d0._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl);
        }
        local_118._0_8_ = &PTR__SmallVector_00930a20;
        if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )local_f8._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_f8,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     local_f8._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl);
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&local_68);
        goto LAB_005d5648;
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool LocalAccessChainConvertPass::GenAccessChainStoreReplacement(
    const Instruction* ptrInst, uint32_t valId,
    std::vector<std::unique_ptr<Instruction>>* newInsts) {
  if (ptrInst->NumInOperands() == 1) {
    // An access chain with no indices is essentially a copy.  However, we still
    // have to create a new store because the old ones will be deleted.
    BuildAndAppendInst(
        spv::Op::OpStore, 0, 0,
        {{spv_operand_type_t::SPV_OPERAND_TYPE_ID,
          {ptrInst->GetSingleWordInOperand(kAccessChainPtrIdInIdx)}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {valId}}},
        newInsts);
    return true;
  }

  // Build and append load of variable in ptrInst
  uint32_t varId;
  uint32_t varPteTypeId;
  const uint32_t ldResultId =
      BuildAndAppendVarLoad(ptrInst, &varId, &varPteTypeId, newInsts);
  if (ldResultId == 0) {
    return false;
  }

  context()->get_decoration_mgr()->CloneDecorations(
      varId, ldResultId, {spv::Decoration::RelaxedPrecision});

  // Build and append Insert
  const uint32_t insResultId = TakeNextId();
  if (insResultId == 0) {
    return false;
  }
  std::vector<Operand> ins_in_opnds = {
      {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {valId}},
      {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {ldResultId}}};
  AppendConstantOperands(ptrInst, &ins_in_opnds);
  BuildAndAppendInst(spv::Op::OpCompositeInsert, varPteTypeId, insResultId,
                     ins_in_opnds, newInsts);

  context()->get_decoration_mgr()->CloneDecorations(
      varId, insResultId, {spv::Decoration::RelaxedPrecision});

  // Build and append Store
  BuildAndAppendInst(spv::Op::OpStore, 0, 0,
                     {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {varId}},
                      {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {insResultId}}},
                     newInsts);
  return true;
}